

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

RGB __thiscall
pbrt::PixelSensor::ToSensorRGB(PixelSensor *this,SampledSpectrum *s,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  Float FVar2;
  Float FVar3;
  undefined1 in_ZMM0 [64];
  undefined1 auVar11 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  RGB RVar19;
  SampledSpectrum SVar20;
  SampledSpectrum local_78;
  SampledSpectrum local_68;
  SampledSpectrum local_58;
  SampledSpectrum local_48;
  SampledSpectrum local_38;
  SampledSpectrum local_28;
  undefined1 extraout_var [60];
  
  auVar18 = in_ZMM1._8_56_;
  auVar11 = in_ZMM0._8_56_;
  SVar20 = DenselySampledSpectrum::Sample(&this->r_bar,lambda);
  auVar12._0_8_ = SVar20.values.values._8_8_;
  auVar12._8_56_ = auVar18;
  auVar4._0_8_ = SVar20.values.values._0_8_;
  auVar4._8_56_ = auVar11;
  local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar4._0_16_,auVar12._0_16_);
  auVar11 = ZEXT856(local_38.values.values._8_8_);
  SVar20 = SampledSpectrum::operator*(&local_38,s);
  auVar13._0_8_ = SVar20.values.values._8_8_;
  auVar13._8_56_ = auVar18;
  auVar5._0_8_ = SVar20.values.values._0_8_;
  auVar5._8_56_ = auVar11;
  local_28.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar13._0_16_);
  auVar6._0_4_ = SampledSpectrum::Average(&local_28);
  auVar6._4_60_ = extraout_var;
  auVar11 = extraout_var._4_56_;
  SVar20 = DenselySampledSpectrum::Sample(&this->g_bar,lambda);
  auVar14._0_8_ = SVar20.values.values._8_8_;
  auVar14._8_56_ = auVar18;
  auVar7._0_8_ = SVar20.values.values._0_8_;
  auVar7._8_56_ = auVar11;
  local_58.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
  auVar11 = ZEXT856(local_58.values.values._8_8_);
  SVar20 = SampledSpectrum::operator*(&local_58,s);
  auVar15._0_8_ = SVar20.values.values._8_8_;
  auVar15._8_56_ = auVar18;
  auVar8._0_8_ = SVar20.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  local_48.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar15._0_16_);
  FVar2 = SampledSpectrum::Average(&local_48);
  auVar11 = extraout_var_00;
  SVar20 = DenselySampledSpectrum::Sample(&this->b_bar,lambda);
  auVar16._0_8_ = SVar20.values.values._8_8_;
  auVar16._8_56_ = auVar18;
  auVar9._0_8_ = SVar20.values.values._0_8_;
  auVar9._8_56_ = auVar11;
  local_78.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar16._0_16_);
  auVar11 = ZEXT856(local_78.values.values._8_8_);
  SVar20 = SampledSpectrum::operator*(&local_78,s);
  auVar17._0_8_ = SVar20.values.values._8_8_;
  auVar17._8_56_ = auVar18;
  auVar10._0_8_ = SVar20.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  local_68.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar17._0_16_);
  FVar3 = SampledSpectrum::Average(&local_68);
  auVar1 = vinsertps_avx(auVar6._0_16_,ZEXT416((uint)FVar2),0x10);
  RVar19._0_8_ = auVar1._0_8_;
  RVar19.b = FVar3;
  return RVar19;
}

Assistant:

PBRT_CPU_GPU
    RGB ToSensorRGB(const SampledSpectrum &s, const SampledWavelengths &lambda) const {
        return RGB((r_bar.Sample(lambda) * s).Average(),
                      (g_bar.Sample(lambda) * s).Average(),
                      (b_bar.Sample(lambda) * s).Average());
    }